

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_buffer.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  MapMethod MVar1;
  int iVar2;
  undefined8 in_RAX;
  GLFWwindow *handle;
  void *pvVar3;
  PFNGLDELETEBUFFERSPROC *pp_Var4;
  char *pcVar5;
  long lVar6;
  size_t sStack_40;
  undefined8 local_38;
  
  local_38 = in_RAX;
  for (lVar6 = 1; lVar6 < argc; lVar6 = lVar6 + 1) {
    pcVar5 = argv[lVar6];
    iVar2 = strcmp(pcVar5,"map_buffer_arb");
    if (iVar2 == 0) {
      MVar1 = MAP_BUFFER_ARB;
    }
    else {
      iVar2 = strcmp(pcVar5,"map_buffer_1_5");
      MVar1 = MAP_BUFFER_1_5;
      if (iVar2 != 0) {
        iVar2 = strcmp(pcVar5,"map_buffer_range");
        MVar1 = MAP_BUFFER_RANGE;
        if (iVar2 != 0) {
          fprintf(_stderr,"error: unexpected arg %s\n",pcVar5);
          iVar2 = 1;
          goto LAB_001080cb;
        }
      }
    }
    mapMethod = MVar1;
  }
  glfwInit();
  glfwWindowHint(0x20004,0);
  handle = glfwCreateWindow(0xfa,0xfa,*argv,(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (handle == (GLFWwindow *)0x0) {
    return 0x7d;
  }
  glfwMakeContextCurrent(handle);
  iVar2 = gladLoadGLLoader(glfwGetProcAddress);
  if (iVar2 == 0) {
    return 1;
  }
  if (mapMethod == MAP_BUFFER_RANGE) {
    if ((GLAD_GL_VERSION_1_5 == 0) ||
       (GLAD_GL_ARB_map_buffer_range == 0 && GLAD_GL_VERSION_3_2 == 0)) {
      pcVar5 = "error: GL_ARB_map_buffer_range not supported\n";
      sStack_40 = 0x2d;
LAB_001080f9:
      fwrite(pcVar5,sStack_40,1,_stderr);
      iVar2 = 0x7d;
LAB_001080cb:
      exit(iVar2);
    }
    (*glad_glGenBuffers)(2,(GLuint *)&local_38);
    (*glad_glBindBuffer)(0x8892,(GLuint)local_38);
    (*glad_glBufferData)(0x8892,1000,(void *)0x0,0x88e4);
    pvVar3 = (*glad_glMapBufferRange)(0x8892,100,200,2);
    memset(pvVar3,0,200);
    (*glad_glUnmapBuffer)(0x8892);
    (*glad_glBindBuffer)(0x8892,local_38._4_4_);
    (*glad_glBufferData)(0x8892,2000,(void *)0x0,0x88e4);
    pvVar3 = (*glad_glMapBufferRange)(0x8892,200,300,0x12);
    memset(pvVar3,0,300);
    (*glad_glBindBuffer)(0x8892,(GLuint)local_38);
    pvVar3 = (*glad_glMapBufferRange)(0x8892,100,200,0x12);
    memset(pvVar3,0,200);
    (*glad_glBindBuffer)(0x8892,local_38._4_4_);
    (*glad_glFlushMappedBufferRange)(0x8892,0x14,0x1e);
    (*glad_glFlushMappedBufferRange)(0x8892,0x28,0x32);
    (*glad_glUnmapBuffer)(0x8892);
    (*glad_glBindBuffer)(0x8892,(GLuint)local_38);
    (*glad_glFlushMappedBufferRange)(0x8892,10,0x14);
    (*glad_glFlushMappedBufferRange)(0x8892,0x1e,0x28);
    (*glad_glUnmapBuffer)(0x8892);
    (*glad_glMapBufferRange)(0x8892,100,200,1);
    (*glad_glUnmapBuffer)(0x8892);
    pp_Var4 = &glad_glDeleteBuffers;
  }
  else if (mapMethod == MAP_BUFFER_1_5) {
    if (GLAD_GL_VERSION_1_5 == 0) {
      pcVar5 = "error: OpenGL version 1.5 not supported\n";
      sStack_40 = 0x28;
      goto LAB_001080f9;
    }
    (*glad_glGenBuffers)(2,(GLuint *)&local_38);
    (*glad_glBindBuffer)(0x8892,(GLuint)local_38);
    (*glad_glBufferData)(0x8892,1000,(void *)0x0,0x88e4);
    pvVar3 = (*glad_glMapBuffer)(0x8892,0x88b9);
    memset(pvVar3,1,1000);
    (*glad_glUnmapBuffer)(0x8892);
    (*glad_glBindBuffer)(0x8892,local_38._4_4_);
    (*glad_glBufferData)(0x8892,2000,(void *)0x0,0x88e4);
    pvVar3 = (*glad_glMapBuffer)(0x8892,0x88b9);
    memset(pvVar3,2,2000);
    (*glad_glBindBuffer)(0x8892,(GLuint)local_38);
    pvVar3 = (*glad_glMapBuffer)(0x8892,0x88b9);
    memset(pvVar3,3,1000);
    (*glad_glBindBuffer)(0x8892,local_38._4_4_);
    (*glad_glUnmapBuffer)(0x8892);
    (*glad_glBindBuffer)(0x8892,(GLuint)local_38);
    (*glad_glUnmapBuffer)(0x8892);
    (*glad_glMapBuffer)(0x8892,35000);
    (*glad_glUnmapBuffer)(0x8892);
    pp_Var4 = &glad_glDeleteBuffers;
  }
  else {
    if (mapMethod != MAP_BUFFER_ARB) goto LAB_00108090;
    (*glad_glGenBuffersARB)(2,(GLuint *)&local_38);
    (*glad_glBindBufferARB)(0x8892,(GLuint)local_38);
    (*glad_glBufferDataARB)(0x8892,1000,(void *)0x0,0x88e4);
    pvVar3 = (*glad_glMapBufferARB)(0x8892,0x88b9);
    memset(pvVar3,1,1000);
    (*glad_glUnmapBufferARB)(0x8892);
    (*glad_glBindBufferARB)(0x8892,local_38._4_4_);
    (*glad_glBufferDataARB)(0x8892,2000,(void *)0x0,0x88e4);
    pvVar3 = (*glad_glMapBufferARB)(0x8892,0x88b9);
    memset(pvVar3,2,2000);
    (*glad_glBindBufferARB)(0x8892,(GLuint)local_38);
    pvVar3 = (*glad_glMapBufferARB)(0x8892,0x88b9);
    memset(pvVar3,3,1000);
    (*glad_glBindBufferARB)(0x8892,local_38._4_4_);
    (*glad_glUnmapBufferARB)(0x8892);
    (*glad_glBindBufferARB)(0x8892,(GLuint)local_38);
    (*glad_glUnmapBufferARB)(0x8892);
    (*glad_glMapBufferARB)(0x8892,35000);
    (*glad_glUnmapBufferARB)(0x8892);
    pp_Var4 = &glad_glDeleteBuffersARB;
  }
  (**pp_Var4)(2,(GLuint *)&local_38);
LAB_00108090:
  glfwDestroyWindow(handle);
  glfwTerminate();
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    parseArgs(argc, argv);

    glfwInit();

    glfwWindowHint(GLFW_VISIBLE, GL_FALSE);
#ifdef __APPLE__
    if (mapMethod == MAP_BUFFER_RANGE) {
        glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 3);
        glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 2);
        glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);
        glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
    }
#endif

    window = glfwCreateWindow(250, 250, argv[0], NULL, NULL);
    if (!window) {
        return EXIT_SKIP;
    }

    glfwMakeContextCurrent(window);

    if (!gladLoadGLLoader((GLADloadproc) glfwGetProcAddress)) {
        return EXIT_FAILURE;
    }

    switch (mapMethod) {
    case MAP_BUFFER_ARB:
        testMapBufferARB();
        break;
    case MAP_BUFFER_1_5:
        testMapBuffer();
        break;
    case MAP_BUFFER_RANGE:
        testMapBufferRange();
        break;
    }

    glfwDestroyWindow(window);
    glfwTerminate();

    return 0;
}